

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O2

base_learner * bs_setup(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *this;
  ostream *poVar2;
  vector<double,_std::allocator<double>_> *this_00;
  base_learner *l;
  single_learner *base;
  learner<bs,_example> *plVar3;
  size_t sStack_3c0;
  allocator local_3ac;
  allocator local_3ab;
  allocator local_3aa;
  allocator local_3a9;
  free_ptr<bs> data;
  string type_string;
  string local_378 [32];
  string local_358;
  string local_338 [32];
  string local_318;
  string local_2f8;
  undefined1 local_2d8 [112];
  bool local_268;
  option_group_definition new_options;
  undefined1 local_200 [112];
  bool local_190;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  typed_option<unsigned_int> local_c0;
  
  scoped_calloc_or_throw<bs>();
  std::__cxx11::string::string((string *)&type_string,"mean",(allocator *)local_2d8);
  std::__cxx11::string::string((string *)&local_2f8,"Bootstrap",(allocator *)local_2d8);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::string((string *)&local_318,"bootstrap",&local_3a9);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_2d8,&local_318,
             &(data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>.
              _M_head_impl)->B);
  local_268 = true;
  std::__cxx11::string::string
            (local_338,"k-way bootstrap by online importance resampling",&local_3aa);
  std::__cxx11::string::_M_assign((string *)(local_2d8 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_c0,(typed_option<unsigned_int> *)local_2d8);
  this = VW::config::option_group_definition::add<unsigned_int>(&new_options,&local_c0);
  std::__cxx11::string::string((string *)&local_358,"bs_type",&local_3ab);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_200,&local_358,&type_string);
  local_190 = true;
  std::__cxx11::string::string(local_378,"prediction type {mean,vote}",&local_3ac);
  std::__cxx11::string::_M_assign((string *)(local_200 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_160,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_200);
  VW::config::option_group_definition::add<std::__cxx11::string>(this,&local_160);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_160);
  std::__cxx11::string::~string(local_378);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_200);
  std::__cxx11::string::~string((string *)&local_358);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_c0);
  std::__cxx11::string::~string(local_338);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_2d8);
  std::__cxx11::string::~string((string *)&local_318);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)local_2d8,"bootstrap",(allocator *)local_200);
  iVar1 = (*options->_vptr_options_i[1])(options,local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  if ((char)iVar1 == '\0') {
    plVar3 = (learner<bs,_example> *)0x0;
    goto LAB_001cb4c9;
  }
  (data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>._M_head_impl)->
  lb = -3.4028235e+38;
  (data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>._M_head_impl)->
  ub = 3.4028235e+38;
  std::__cxx11::string::string((string *)local_2d8,"bs_type",(allocator *)local_200);
  iVar1 = (*options->_vptr_options_i[1])(options,local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  if ((char)iVar1 == '\0') {
LAB_001cb420:
    sStack_3c0 = 0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&type_string);
    if (iVar1 == 0) goto LAB_001cb420;
    iVar1 = std::__cxx11::string::compare((char *)&type_string);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "warning: bs_type must be in {\'mean\',\'vote\'}; resetting to mean."
                              );
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_001cb420;
    }
    sStack_3c0 = 1;
  }
  (data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>._M_head_impl)->
  bs_type = sStack_3c0;
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>._M_head_impl)->
  pred_vec = this_00;
  std::vector<double,_std::allocator<double>_>::reserve
            (this_00,(ulong)(data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_bs_*,_false>._M_head_impl)->B);
  (data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>._M_head_impl)->
  all = all;
  l = setup_base(options,all);
  base = LEARNER::as_singleline<char,char>(l);
  plVar3 = LEARNER::init_learner<bs,example,LEARNER::learner<char,example>>
                     (&data,base,predict_or_learn<true>,predict_or_learn<false>,
                      (ulong)(data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.
                              super__Head_base<0UL,_bs_*,_false>._M_head_impl)->B);
  *(undefined8 *)(plVar3 + 0x58) = *(undefined8 *)(plVar3 + 0x18);
  *(code **)(plVar3 + 0x68) = finish_example;
  *(undefined8 *)(plVar3 + 0xb8) = *(undefined8 *)(plVar3 + 0x18);
  *(undefined8 *)(plVar3 + 0xc0) = *(undefined8 *)(plVar3 + 0x20);
  *(code **)(plVar3 + 200) = finish;
LAB_001cb4c9:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&type_string);
  std::unique_ptr<bs,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar3;
}

Assistant:

base_learner* bs_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<bs>();
  std::string type_string("mean");
  option_group_definition new_options("Bootstrap");
  new_options.add(make_option("bootstrap", data->B).keep().help("k-way bootstrap by online importance resampling"))
      .add(make_option("bs_type", type_string).keep().help("prediction type {mean,vote}"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("bootstrap"))
    return nullptr;

  data->ub = FLT_MAX;
  data->lb = -FLT_MAX;

  if (options.was_supplied("bs_type"))
  {
    if (type_string.compare("mean") == 0)
      data->bs_type = BS_TYPE_MEAN;
    else if (type_string.compare("vote") == 0)
      data->bs_type = BS_TYPE_VOTE;
    else
    {
      std::cerr << "warning: bs_type must be in {'mean','vote'}; resetting to mean." << std::endl;
      data->bs_type = BS_TYPE_MEAN;
    }
  }
  else  // by default use mean
    data->bs_type = BS_TYPE_MEAN;

  data->pred_vec = new vector<double>();
  data->pred_vec->reserve(data->B);
  data->all = &all;

  learner<bs, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->B);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}